

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O3

size_t IpmiFruWriteCommonAreas(FILE *ofd)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  common_header.format_version = '\x01';
  common_header.internal_use_area_offset = '\0';
  common_header.chassis_info_area_offset = '\0';
  common_header.board_info_area_offset = '\0';
  common_header.product_info_area_offset = '\0';
  common_header.multirecord_area_offset = '\0';
  common_header.pad = '\0';
  common_header.checksum = '\0';
  if (chassis_info_area_size == 0) {
    bVar5 = 1;
    cVar1 = -1;
  }
  else {
    common_header.format_version = '\x01';
    common_header.internal_use_area_offset = '\0';
    common_header.chassis_info_area_offset = '\x01';
    common_header.board_info_area_offset = '\0';
    common_header.product_info_area_offset = '\0';
    common_header.multirecord_area_offset = '\0';
    common_header.pad = '\0';
    common_header.checksum = '\0';
    bVar5 = (char)(chassis_info_area_size >> 3) + 1;
    cVar1 = -2;
  }
  if (board_info_area_size == 0) {
    bVar4 = 0;
    bVar6 = bVar5;
  }
  else {
    common_header.board_info_area_offset = bVar5;
    common_header.product_info_area_offset = '\0';
    common_header.multirecord_area_offset = '\0';
    common_header.pad = '\0';
    common_header.checksum = '\0';
    bVar6 = (char)(board_info_area_size >> 3) + bVar5;
    bVar4 = bVar5;
  }
  if (product_info_area_size == 0) {
    bVar5 = 0;
  }
  else {
    common_header.product_info_area_offset = bVar6;
    common_header.multirecord_area_offset = '\0';
    common_header.pad = '\0';
    common_header.checksum = '\0';
    bVar5 = bVar6;
    bVar6 = (char)(product_info_area_size >> 3) + bVar6;
  }
  common_header.multirecord_area_offset = bVar6;
  common_header.pad = '\0';
  common_header.checksum = cVar1 - (bVar4 + bVar6 + bVar5);
  sVar2 = fwrite(&common_header,1,8,(FILE *)ofd);
  if (sVar2 == 0) {
    IpmiFruWriteCommonAreas_cold_4();
LAB_00101453:
    sVar3 = 0xffffffffffffffff;
  }
  else {
    if ((ulong)chassis_info_area_size != 0) {
      sVar2 = fwrite(&chassis_info_area,1,(ulong)chassis_info_area_size,(FILE *)ofd);
      if (sVar2 == 0) {
        IpmiFruWriteCommonAreas_cold_1();
        goto LAB_00101453;
      }
    }
    if ((ulong)board_info_area_size != 0) {
      sVar2 = fwrite(&board_info_area,1,(ulong)board_info_area_size,(FILE *)ofd);
      if (sVar2 == 0) {
        IpmiFruWriteCommonAreas_cold_2();
        goto LAB_00101453;
      }
    }
    if ((ulong)product_info_area_size != 0) {
      sVar2 = fwrite(&product_info_area,1,(ulong)product_info_area_size,(FILE *)ofd);
      if (sVar2 == 0) {
        IpmiFruWriteCommonAreas_cold_3();
        goto LAB_00101453;
      }
    }
    sVar3 = (ulong)bVar6 << 3;
  }
  return sVar3;
}

Assistant:

size_t IpmiFruWriteCommonAreas(FILE *ofd)
{
    //  First, populate the common header
    memset(&common_header, 0, sizeof(common_header));
    common_header.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    uint8_t running_offset = 1;
    if (chassis_info_area_size) {
        common_header.chassis_info_area_offset = running_offset;
        running_offset += chassis_info_area_size / 8;
    }
    if (board_info_area_size) {
        common_header.board_info_area_offset = running_offset;
        running_offset += board_info_area_size / 8;
    }
    if (product_info_area_size) {
        common_header.product_info_area_offset = running_offset;
        running_offset += product_info_area_size / 8;
    }
    common_header.multirecord_area_offset = running_offset;
    uint8_t checksum = 
        common_header.format_version +
        common_header.chassis_info_area_offset +
        common_header.board_info_area_offset +
        common_header.product_info_area_offset +
        common_header.multirecord_area_offset;
    common_header.checksum = -checksum;
    //  Write the common header
    if (fwrite(&common_header, 1, sizeof(common_header), ofd) <= 0) {
        fprintf(stderr, "Failed to write common header to the output file\n");
        return -1;
    }
    //  Write chassis info area
    if (chassis_info_area_size) {
        if (fwrite(&chassis_info_area, 1, chassis_info_area_size, ofd) <= 0) {
            fprintf(stderr, "Failed to write chassis info to the output file\n");
            return -1;
        }
    }
    //  Write board info area
    if (board_info_area_size) {
        if (fwrite(&board_info_area, 1, board_info_area_size, ofd) <= 0) {
            fprintf(stderr, "Failed to write board info to the output file\n");
            return -1;
        }
    }
    //  Write product info area
    if (product_info_area_size) {
        if (fwrite(&product_info_area, 1, product_info_area_size, ofd) <= 0) {
            fprintf(stderr, "Failed to write product info to the output file\n");
            return -1;
        }
    }
    return (size_t)running_offset * 8;
}